

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidatorKeys_test.cpp
# Opt level: O0

void __thiscall jbcoin::tests::ValidatorKeys_test::testRevoke(ValidatorKeys_test *this)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  const_iterator pvVar4;
  void *data;
  size_t size;
  reference_const_type puVar5;
  reference_const_type lhs;
  PublicKey *pPVar6;
  SF_Blob *in_R8;
  bool local_191;
  Slice local_190;
  bool local_179;
  undefined1 local_178 [8];
  optional<jbcoin::Slice> pk;
  type local_158;
  optional<unsigned_int> seq;
  SerialIter sit;
  string manifest;
  STObject st;
  string revocation;
  ValidatorKeys keys;
  value_type keyType;
  const_iterator __end2;
  const_iterator __begin2;
  array<jbcoin::KeyType,_2UL> *__range2;
  allocator local_31;
  string local_30;
  ValidatorKeys_test *local_10;
  ValidatorKeys_test *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"Revoke",&local_31);
  beast::unit_test::suite::testcase_t::operator()
            (&(this->super_suite).testcase,&local_30,no_abort_on_fail);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  __end2 = std::array<jbcoin::KeyType,_2UL>::begin(&this->keyTypes);
  pvVar4 = std::array<jbcoin::KeyType,_2UL>::end(&this->keyTypes);
  for (; __end2 != pvVar4; __end2 = __end2 + 1) {
    keys._92_4_ = *__end2;
    ValidatorKeys::ValidatorKeys
              ((ValidatorKeys *)(revocation.field_2._M_local_buf + 8),(KeyType *)&keys.revoked_);
    ValidatorKeys::revoke_abi_cxx11_((ValidatorKeys *)&st.mType,revocation.field_2._M_local_buf + 8)
    ;
    STObject::STObject((STObject *)((long)&manifest.field_2 + 8),(SField *)sfGeneric);
    beast::detail::base64_decode<void>((string *)&sit.used_,(string *)&st.mType);
    data = (void *)std::__cxx11::string::data();
    size = std::__cxx11::string::size();
    SerialIter::SerialIter((SerialIter *)&seq,data,size);
    STObject::set((STObject *)((long)&manifest.field_2 + 8),(SerialIter *)&seq,0);
    local_158 = (type)get<jbcoin::STInteger<unsigned_int>>
                                ((STObject *)((long)&manifest.field_2 + 8),
                                 (TypedField<jbcoin::STInteger<unsigned_int>_> *)sfSequence);
    beast::unit_test::suite::expect<boost::optional<unsigned_int>>
              (&this->super_suite,(optional<unsigned_int> *)&local_158,
               "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/src/test/ValidatorKeys_test.cpp"
               ,0xfa);
    puVar5 = boost::optional<unsigned_int>::operator*((optional<unsigned_int> *)&local_158);
    uVar1 = *puVar5;
    uVar2 = std::numeric_limits<unsigned_int>::max();
    pk.super_type.m_storage.dummy_.data[0xf] = uVar1 == uVar2;
    beast::unit_test::suite::expect<bool>
              (&this->super_suite,(bool *)(pk.super_type.m_storage.dummy_.data + 0xf),
               "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/src/test/ValidatorKeys_test.cpp"
               ,0xfb);
    get<jbcoin::STBlob>((optional<jbcoin::Slice> *)local_178,
                        (STObject *)((long)&manifest.field_2 + 8),
                        (TypedField<jbcoin::STBlob> *)sfPublicKey);
    beast::unit_test::suite::expect<boost::optional<jbcoin::Slice>>
              (&this->super_suite,(optional<jbcoin::Slice> *)local_178,
               "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/src/test/ValidatorKeys_test.cpp"
               ,0xfe);
    lhs = boost::optional<jbcoin::Slice>::operator*((optional<jbcoin::Slice> *)local_178);
    pPVar6 = ValidatorKeys::publicKey((ValidatorKeys *)((long)&revocation.field_2 + 8));
    local_190 = PublicKey::operator_cast_to_Slice(pPVar6);
    local_179 = jbcoin::operator==(lhs,&local_190);
    beast::unit_test::suite::expect<bool>
              (&this->super_suite,&local_179,
               "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/src/test/ValidatorKeys_test.cpp"
               ,0xff);
    pPVar6 = ValidatorKeys::publicKey((ValidatorKeys *)((long)&revocation.field_2 + 8));
    iVar3 = verify((jbcoin *)(manifest.field_2._M_local_buf + 8),(STObject *)&HashPrefix::manifest,
                   (HashPrefix *)pPVar6,(PublicKey *)sfMasterSignature,in_R8);
    local_191 = (bool)((byte)iVar3 & 1);
    beast::unit_test::suite::expect<bool>
              (&this->super_suite,&local_191,
               "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/src/test/ValidatorKeys_test.cpp"
               ,0x102);
    boost::optional<jbcoin::Slice>::~optional((optional<jbcoin::Slice> *)local_178);
    std::__cxx11::string::~string((string *)&sit.used_);
    STObject::~STObject((STObject *)((long)&manifest.field_2 + 8));
    std::__cxx11::string::~string((string *)&st.mType);
    ValidatorKeys::~ValidatorKeys((ValidatorKeys *)((long)&revocation.field_2 + 8));
  }
  return;
}

Assistant:

void
    testRevoke ()
    {
        testcase ("Revoke");

        for (auto const keyType : keyTypes)
        {
            ValidatorKeys keys (keyType);

            auto const revocation = keys.revoke ();

            STObject st (sfGeneric);
            auto const manifest = beast::detail::base64_decode(revocation);
            SerialIter sit (manifest.data (), manifest.size ());
            st.set (sit);

            auto const seq = get (st, sfSequence);
            BEAST_EXPECT (seq);
            BEAST_EXPECT (*seq == std::numeric_limits<std::uint32_t>::max ());

            auto const pk = get (st, sfPublicKey);
            BEAST_EXPECT (pk);
            BEAST_EXPECT (*pk == keys.publicKey ());
            BEAST_EXPECT (verify (
                st, HashPrefix::manifest, keys.publicKey (),
                sfMasterSignature));
        }
    }